

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_entry * stumpless_set_entry_msgid(stumpless_entry *entry,char *msgid)

{
  _Bool _Var1;
  size_t local_28;
  size_t new_msgid_length;
  char *msgid_local;
  stumpless_entry *entry_local;
  
  new_msgid_length = (size_t)msgid;
  msgid_local = (char *)entry;
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    entry_local = (stumpless_entry *)0x0;
  }
  else {
    if ((msgid != (char *)0x0) && (_Var1 = validate_msgid(msgid,&local_28), !_Var1)) {
      return (stumpless_entry *)0x0;
    }
    lock_entry((stumpless_entry *)msgid_local);
    if (new_msgid_length == 0) {
      msgid_local[0x1f0] = '-';
      msgid_local[0x1f1] = '\0';
      msgid_local[0x218] = '\x01';
      msgid_local[0x219] = '\0';
      msgid_local[0x21a] = '\0';
      msgid_local[0x21b] = '\0';
      msgid_local[0x21c] = '\0';
      msgid_local[0x21d] = '\0';
      msgid_local[0x21e] = '\0';
      msgid_local[0x21f] = '\0';
    }
    else {
      *(size_t *)(msgid_local + 0x218) = local_28;
      memcpy(msgid_local + 0x1f0,(void *)new_msgid_length,local_28);
      msgid_local[local_28 + 0x1f0] = '\0';
    }
    unlock_entry((stumpless_entry *)msgid_local);
    clear_error();
    entry_local = (stumpless_entry *)msgid_local;
  }
  return entry_local;
}

Assistant:

struct stumpless_entry *
stumpless_set_entry_msgid( struct stumpless_entry *entry,
                           const char *msgid ) {
  size_t new_msgid_length;

  VALIDATE_ARG_NOT_NULL( entry );

  if( unlikely( msgid && !validate_msgid( msgid, &new_msgid_length ) ) ) {
    return NULL;
  }

  lock_entry( entry );
  if( msgid ) {
    entry->msgid_length = new_msgid_length;
    memcpy( entry->msgid, msgid, new_msgid_length );
    entry->msgid[new_msgid_length] = '\0';
  } else {
    entry->msgid[0] = '-';
    entry->msgid[1] = '\0';
    entry->msgid_length = 1;
  }
  unlock_entry( entry );

  clear_error(  );
  return entry;
}